

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ImFontAtlas(ImFontAtlas *this)

{
  this->TexDesiredWidth = 0;
  this->TexGlyphPadding = 1;
  this->TexPixelsRGBA32 = (uint *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  this->TexID = (ImTextureID)0x0;
  this->TexPixelsAlpha8 = (uchar *)0x0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  (this->Fonts).Size = 0;
  (this->Fonts).Capacity = 0;
  (this->Fonts).Data = (ImFont **)0x0;
  (this->CustomRects).Size = 0;
  (this->CustomRects).Capacity = 0;
  (this->CustomRects).Data = (CustomRect *)0x0;
  (this->ConfigData).Size = 0;
  (this->ConfigData).Capacity = 0;
  (this->ConfigData).Data = (ImFontConfig *)0x0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  return;
}

Assistant:

ImFontAtlas::ImFontAtlas()
{
    TexID = NULL;
    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
    TexWidth = TexHeight = TexDesiredWidth = 0;
    TexGlyphPadding = 1;
    TexUvWhitePixel = ImVec2(0, 0);
}